

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

_Bool is_valid_option(dropt_option *option)

{
  if (option == (dropt_option *)0x0) {
    return false;
  }
  if ((((option->long_name == (dropt_char *)0x0) && (option->short_name == '\0')) &&
      (option->description == (dropt_char *)0x0)) &&
     (((option->arg_description == (dropt_char *)0x0 &&
       (option->handler == (dropt_option_handler_func)0x0)) &&
      ((option->dest == (void *)0x0 && (option->attr == 0)))))) {
    return option->extra_data != 0;
  }
  return true;
}

Assistant:

static bool
is_valid_option(const dropt_option* option)
{
    return    option != NULL
           && !(   option->long_name == NULL
                && option->short_name == DROPT_TEXT_LITERAL('\0')
                && option->description == NULL
                && option->arg_description == NULL
                && option->handler == NULL
                && option->dest == NULL
                && option->attr == 0
                && option->extra_data == 0);
}